

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseOutgoing.cpp
# Opt level: O1

Result __thiscall
tonk::SessionOutgoing::OnAcknowledgements
          (SessionOutgoing *this,uint8_t *data,uint bytes,Counter64 *ackNonce,uint64_t receiveUsec)

{
  ostringstream *this_00;
  long lVar1;
  BandwidthShape *pBVar2;
  uint uVar3;
  SiameseResult SVar4;
  _func_int **pp_Var5;
  OutputWorker *this_01;
  uint uVar6;
  undefined4 in_register_00000014;
  byte *pbVar7;
  long lVar8;
  undefined8 in_R9;
  uint8_t ackack [4];
  BandwidthShape shape;
  int local_1bc;
  undefined1 local_1b8 [392];
  
  pbVar7 = (byte *)CONCAT44(in_register_00000014,bytes);
  uVar6 = (uint)ackNonce;
  if (uVar6 < 6) {
    local_1b8._0_8_ = (long)local_1b8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"Truncated Ack","");
    pp_Var5 = (_func_int **)operator_new(0x38);
    *pp_Var5 = (_func_int *)"SessionOutgoing::OnAcknowledgements";
    pp_Var5[1] = (_func_int *)(pp_Var5 + 3);
    std::__cxx11::string::_M_construct<char*>
              ((string *)(pp_Var5 + 1),local_1b8._0_8_,
               (char *)(CONCAT44(local_1b8._12_4_,local_1b8._8_4_) + local_1b8._0_8_));
  }
  else {
    if (*(long *)receiveUsec - *(long *)(data + 0x2e8) < 0) {
      pBVar2 = *(BandwidthShape **)(data + 0x208);
      if ((int)pBVar2[1].AppBPS < 2) {
        local_1b8._0_8_ = *pBVar2;
        this_00 = (ostringstream *)(local_1b8 + 0x10);
        local_1b8._8_4_ = Debug;
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,(char *)pBVar2[7],(long)pBVar2[8]);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,"Ignored re-ordered ack",0x16);
        this_01 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(this_01,(LogStringBuffer *)local_1b8);
        std::__cxx11::ostringstream::~ostringstream(this_00);
        std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
      }
LAB_0012db2a:
      (this->super_IIncomingToOutgoing)._vptr_IIncomingToOutgoing = (_func_int **)0x0;
      return (Result)(ErrorResult *)this;
    }
    *(long *)(data + 0x2e8) = *(long *)receiveUsec + 1;
    lVar1 = *(long *)(data + 0x2f8);
    uVar3 = ((uint)*pbVar7 | (uint)pbVar7[1] << 8 | (uint)pbVar7[2] << 0x10) - (int)lVar1;
    lVar8 = (ulong)(uVar3 & 0xffffff) - (ulong)(uVar3 * 2 & 0x1000000);
    if (-1 < lVar8) {
      if ((uVar6 == 6) ||
         (SVar4 = siamese_encoder_ack(*(SiameseEncoder *)(data + 0x2d0),pbVar7 + 6,uVar6 - 6,
                                      (uint *)(data + 0x300)), SVar4 == Siamese_Success)) {
        *(long *)(data + 0x2f8) = lVar8 + lVar1;
        *(undefined8 *)(data + 0x2f0) = in_R9;
        local_1b8._0_4_ = 0;
        local_1b8._4_4_ = 0.0;
        BandwidthShape::Decompress((BandwidthShape *)local_1b8,pbVar7 + 3);
        SenderBandwidthControl::OnReceiverFeedback
                  (*(SenderBandwidthControl **)(data + 0x220),(BandwidthShape)local_1b8._0_8_);
        local_1bc = *(int *)(data + 0x300);
        if (local_1bc == *(int *)(data + 0x308)) {
          (**(code **)(*(long *)data + 0x10))(this,data,2,&local_1bc,3);
          return (Result)(ErrorResult *)this;
        }
        goto LAB_0012db2a;
      }
      local_1b8._0_8_ = (long)local_1b8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b8,"siamese_encoder_ack failed","");
      pp_Var5 = (_func_int **)operator_new(0x38);
      *pp_Var5 = (_func_int *)"SessionOutgoing::OnAcknowledgements";
      pp_Var5[1] = (_func_int *)(pp_Var5 + 3);
      std::__cxx11::string::_M_construct<char*>
                ((string *)(pp_Var5 + 1),local_1b8._0_8_,
                 (char *)(CONCAT44(local_1b8._12_4_,local_1b8._8_4_) + local_1b8._0_8_));
      *(undefined4 *)(pp_Var5 + 5) = 1;
      pp_Var5[6] = (_func_int *)(long)(int)SVar4;
      goto LAB_0012d926;
    }
    local_1b8._0_8_ = (long)local_1b8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b8,"Ack was sent out of order","");
    pp_Var5 = (_func_int **)operator_new(0x38);
    *pp_Var5 = (_func_int *)"SessionOutgoing::OnAcknowledgements";
    pp_Var5[1] = (_func_int *)(pp_Var5 + 3);
    std::__cxx11::string::_M_construct<char*>
              ((string *)(pp_Var5 + 1),local_1b8._0_8_,
               (char *)(CONCAT44(local_1b8._12_4_,local_1b8._8_4_) + local_1b8._0_8_));
  }
  *(undefined4 *)(pp_Var5 + 5) = 0;
  pp_Var5[6] = (_func_int *)0x9;
LAB_0012d926:
  (this->super_IIncomingToOutgoing)._vptr_IIncomingToOutgoing = pp_Var5;
  if (local_1b8._0_8_ != (long)local_1b8 + 0x10) {
    operator_delete((void *)local_1b8._0_8_);
  }
  return (Result)(ErrorResult *)this;
}

Assistant:

Result SessionOutgoing::OnAcknowledgements(
    const uint8_t* data,
    unsigned bytes,
    Counter64 ackNonce,
    uint64_t receiveUsec)
{
    if (bytes < kAckOverheadBytes) {
        return Result("SessionOutgoing::OnAcknowledgements", "Truncated Ack", ErrorType::Tonk, Tonk_InvalidData);
    }

    // If ack was received out of order:
    if (ackNonce < LastAck.NextAcceptableNonce)
    {
        Deps.Logger->Debug("Ignored re-ordered ack");
        return Result::Success();
    }
    LastAck.NextAcceptableNonce = ackNonce + 1;

    // Decompress nonce field back to full size
    const Counter24 partialNonce = siamese::ReadU24_LE(data);
    const Counter64 recovered = Counter64::ExpandFromTruncated(LastAck.PeerNextExpectedNonce, partialNonce);

    // If ack was sent out of order:
    if (recovered < LastAck.PeerNextExpectedNonce) {
        return Result("SessionOutgoing::OnAcknowledgements", "Ack was sent out of order", ErrorType::Tonk, Tonk_InvalidData);
    }

    // If there is Ack data attached:
    if (bytes > kAckOverheadBytes)
    {
        // Process acknowledgement with encoder
        const int ackResult = siamese_encoder_ack(
            FECEncoder,
            data + kAckOverheadBytes,
            bytes - kAckOverheadBytes,
            &LastAck.PeerNextExpectedSeqNum);

        if (Siamese_Success != ackResult) {
            return Result("SessionOutgoing::OnAcknowledgements", "siamese_encoder_ack failed", ErrorType::Siamese, ackResult);
        }
    }

    // Message is validated - update state
    LastAck.PeerNextExpectedNonce = recovered;
    LastAck.ReceiveUsec = receiveUsec;

    // Update bandwidth control with realtime feedback
    BandwidthShape shape;
    shape.Decompress(data + 3);
    Deps.SenderControl->OnReceiverFeedback(shape);

    // If the peer is now caught up:
    if (PeerCaughtUp())
    {
        TONK_VERBOSE_OUTGOING_LOG("Peer caught up - sending AckAck for seqno=", LastAck.PeerNextExpectedSeqNum);

        // Send an AckAck
        uint8_t ackack[4];
        siamese::WriteU24_LE_Min4Bytes(ackack, LastAck.PeerNextExpectedSeqNum);

        return QueueUnreliable(
            protocol::MessageType_AckAck,
            ackack,
            protocol::kAckAckBytes);
    }

    TONK_VERBOSE_OUTGOING_LOG("Got Ack PeerNextExpectedSeq=", LastAck.PeerNextExpectedSeqNum,
        " PeerNextExpectedNonce=", LastAck.PeerNextExpectedNonce.ToUnsigned(), " bytes=", bytes);

    return Result::Success();
}